

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O2

bool TPZChangeEl::NearestNode(TPZGeoEl *gel,TPZVec<double> *x,int64_t *meshNode,double tol)

{
  int iVar1;
  TPZGeoNode *this;
  int64_t iVar2;
  long lVar3;
  int iVar4;
  int i;
  double dVar5;
  double dVar6;
  TPZVec<double> nodeCoord;
  
  *meshNode = -1;
  TPZVec<double>::TPZVec(&nodeCoord,3);
  iVar1 = (**(code **)(*(long *)gel + 0x90))(gel);
  i = 0;
  iVar4 = 0;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  do {
    if (i == iVar4) {
LAB_00f295e2:
      TPZVec<double>::~TPZVec(&nodeCoord);
      return i < iVar1;
    }
    this = TPZGeoEl::NodePtr(gel,i);
    TPZGeoNode::GetCoordinates(this,&nodeCoord);
    dVar5 = 0.0;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      dVar6 = x->fStore[lVar3] - nodeCoord.fStore[lVar3];
      dVar5 = dVar5 + dVar6 * dVar6;
    }
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    if (dVar5 <= tol) {
      iVar2 = (**(code **)(*(long *)gel + 0xa8))(gel,i);
      *meshNode = iVar2;
      goto LAB_00f295e2;
    }
    i = i + 1;
  } while( true );
}

Assistant:

bool TPZChangeEl::NearestNode(TPZGeoEl * gel, TPZVec<REAL> &x, int64_t &meshNode, double tol)
{    
	meshNode = -1;
	bool IsNearSomeNode = false;
	
	TPZVec<REAL> nodeCoord(3);
	int nnodes = gel->NNodes();
	
	for(int n = 0; n < nnodes; n++)
	{
		double dist = 0.;
		gel->NodePtr(n)->GetCoordinates(nodeCoord);
		for(int c = 0; c < 3; c++)
		{
			dist += (x[c] - nodeCoord[c])*(x[c] - nodeCoord[c]);
		}
		dist = sqrt(dist);
		
		if(dist <= tol)
		{
			meshNode = gel->NodeIndex(n);
			IsNearSomeNode = true;
			break;
		}
	}
	
	return IsNearSomeNode;
}